

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O2

void Calculate<1ul>(Data *input,size_t begin,HashTable<1UL> *table)

{
  pointer puVar1;
  undefined4 in_EAX;
  MappedReference<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>_> puVar2;
  pointer puVar3;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)CONCAT14((input->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start[begin],in_EAX);
  puVar2 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
           ::operator[]<Key<1ul>,phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
                       *)table,(key_arg<Key<1UL>_> *)((long)&uStack_28 + 4));
  *puVar2 = *puVar2 + 1;
  puVar1 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + begin;
  while (puVar3 = puVar3 + 4, puVar3 < puVar1) {
    uStack_28 = (ulong)CONCAT14(*puVar3,(undefined4)uStack_28) & 0x3ffffffff;
    puVar2 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
             ::operator[]<Key<1ul>,phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
                         *)table,(key_arg<Key<1UL>_> *)((long)&uStack_28 + 4));
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void Calculate(const Cfg::Data& input, size_t begin, HashTable<size>& table)
{
    // original implementation fully recomputes the hash key for each
    // insert to the hash table. This implementation only partially
    // updates the hash, this is the same with C GCC, Rust #6 and Rust #4
    Key<size> key;
    // initialize key
    key.InitKey(input.data() + begin);
    // use key to increment value
    ++table[key];

    auto itr_begin = input.data() + begin + thread_count;
    auto itr_end = (input.data() + input.size() + 1) - size;
    size_t nsize = std::min(size, thread_count);
    for(;itr_begin < itr_end; itr_begin += thread_count) {
        // update the key 1 byte at a time
        for(unsigned i = 0; i < nsize; ++i)
            key.UpdateKey( itr_begin[i] );

        // then finally mask out excess information
        key.MaskKey();

        // then use key to increment value
        ++table[key];
    }
}